

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

ByteVector * __thiscall
ImgfsFile::DirEntry::getdatablock
          (ByteVector *__return_storage_ptr__,DirEntry *this,ImgfsFile *imgfs)

{
  ByteVectorWriter *this_00;
  ReadWriter_ptr local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (ByteVectorWriter *)operator_new(0x30);
  ByteVectorWriter::ByteVectorWriter(this_00,__return_storage_ptr__);
  std::__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ByteVectorWriter,void>
            ((__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2> *)&local_30,this_00);
  savedirent(this,imgfs,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

ByteVector getdatablock(ImgfsFile& imgfs)
        {
            ByteVector filedata;
            savedirent(imgfs, ReadWriter_ptr(new ByteVectorWriter(filedata)));
            return filedata;
        }